

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

int __thiscall jbcoin::Serializer::add64(Serializer *this,uint64_t i)

{
  size_type sVar1;
  value_type_conflict local_24;
  value_type_conflict local_23;
  value_type_conflict local_22;
  value_type_conflict local_21;
  value_type_conflict local_20;
  value_type_conflict local_1f;
  value_type_conflict local_1e;
  value_type_conflict local_1d;
  int local_1c;
  uint64_t uStack_18;
  int ret;
  uint64_t i_local;
  Serializer *this_local;
  
  uStack_18 = i;
  i_local = (uint64_t)this;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mData);
  local_1c = (int)sVar1;
  local_1d = (value_type_conflict)(uStack_18 >> 0x38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_1d);
  local_1e = (value_type_conflict)(uStack_18 >> 0x30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_1e);
  local_1f = (value_type_conflict)(uStack_18 >> 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_1f);
  local_20 = (value_type_conflict)(uStack_18 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_20);
  local_21 = (value_type_conflict)(uStack_18 >> 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_21);
  local_22 = (value_type_conflict)(uStack_18 >> 0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_22);
  local_23 = (value_type_conflict)(uStack_18 >> 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_23);
  local_24 = (value_type_conflict)uStack_18;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_24);
  return local_1c;
}

Assistant:

int Serializer::add64 (std::uint64_t i)
{
    int ret = mData.size ();
    mData.push_back (static_cast<unsigned char> (i >> 56));
    mData.push_back (static_cast<unsigned char> ((i >> 48) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 40) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 32) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 24) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 16) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 8) & 0xff));
    mData.push_back (static_cast<unsigned char> (i & 0xff));
    return ret;
}